

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any.h
# Opt level: O2

void __thiscall dap::any::free(any *this,void *__ptr)

{
  if (this->value != (void *)0x0) {
    if (this->heap != (void *)0x0) {
      operator_delete__(this->heap);
      this->heap = (void *)0x0;
    }
    this->value = (void *)0x0;
    return;
  }
  __assert_fail("value != nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmcppdap/include/dap/any.h"
                ,0xc3,"void dap::any::free()");
}

Assistant:

void any::free() {
  assert(value != nullptr);
  if (heap != nullptr) {
    delete[] reinterpret_cast<uint8_t*>(heap);
    heap = nullptr;
  }
  value = nullptr;
}